

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_buildSeqStore(ZSTD_CCtx *zc,void *src,size_t srcSize)

{
  undefined4 uVar1;
  BYTE *pBVar2;
  ZSTD_compressionParameters cParams1;
  ZSTD_compressionParameters cParams2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  uint uVar13;
  ZSTD_dictMode_e dictMode_00;
  ZSTD_matchState_t *ms_00;
  size_t sVar14;
  ZSTD_blockCompressor p_Var15;
  undefined4 in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffef4;
  ZSTD_strategy in_stack_fffffffffffffef8;
  undefined4 uVar16;
  undefined4 uStack_104;
  int local_100;
  BYTE *lastLiterals;
  ZSTD_blockCompressor blockCompressor_1;
  ZSTD_blockCompressor blockCompressor;
  size_t err_code_1;
  size_t seqLenSum;
  ZSTD_sequencePosition seqPos;
  size_t nbPostProcessedSeqs;
  size_t nbExternalSeqs;
  U32 windowSize;
  size_t err_code;
  rawSeqStore_t ldmSeqStore;
  size_t sStack_70;
  int i;
  size_t lastLLSize;
  ZSTD_dictMode_e dictMode;
  U32 curr;
  BYTE *istart;
  BYTE *base;
  ZSTD_matchState_t *ms;
  size_t srcSize_local;
  void *src_local;
  ZSTD_CCtx *zc_local;
  
  ms_00 = &(zc->blockState).matchState;
  if (0x20000 < srcSize) {
    __assert_fail("srcSize <= ZSTD_BLOCKSIZE_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0xc4e,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
  }
  uVar3 = (zc->appliedParams).cParams.hashLog;
  uVar4 = (zc->appliedParams).cParams.searchLog;
  uVar5 = (zc->appliedParams).cParams.minMatch;
  uVar6 = (zc->appliedParams).cParams.targetLength;
  uVar7 = (zc->appliedParams).cParams.strategy;
  cParams1.minMatch = uVar7;
  cParams1.searchLog = uVar6;
  cParams1.hashLog = uVar5;
  cParams1.chainLog = uVar4;
  cParams1.windowLog = uVar3;
  uVar1 = (zc->blockState).matchState.cParams.windowLog;
  uVar8 = (zc->blockState).matchState.cParams.hashLog;
  uVar9 = (zc->blockState).matchState.cParams.searchLog;
  uVar10 = (zc->blockState).matchState.cParams.minMatch;
  uVar11 = (zc->blockState).matchState.cParams.targetLength;
  uVar12 = (zc->blockState).matchState.cParams.strategy;
  cParams2.minMatch = uVar12;
  cParams2.searchLog = uVar11;
  cParams2.hashLog = uVar10;
  cParams2.chainLog = uVar9;
  cParams2.windowLog = uVar8;
  cParams1.targetLength = in_stack_fffffffffffffed4;
  cParams1.strategy = uVar1;
  cParams2.targetLength = in_stack_fffffffffffffef4;
  cParams2.strategy = in_stack_fffffffffffffef8;
  ZSTD_assertEqualCParams(cParams1,cParams2);
  if (srcSize < 7) {
    if ((zc->appliedParams).cParams.strategy < ZSTD_btopt) {
      ZSTD_ldm_skipSequences(&zc->externSeqStore,srcSize,(zc->appliedParams).cParams.minMatch);
    }
    else {
      ZSTD_ldm_skipRawSeqStoreBytes(&zc->externSeqStore,srcSize);
    }
    return 1;
  }
  ZSTD_resetSeqStore(&zc->seqStore);
  (zc->blockState).matchState.opt.symbolCosts = &((zc->blockState).prevCBlock)->entropy;
  (zc->blockState).matchState.opt.literalCompressionMode =
       (zc->appliedParams).literalCompressionMode;
  if (((zc->blockState).matchState.dictMatchState != (ZSTD_matchState_t *)0x0) &&
     ((zc->blockState).matchState.loadedDictEnd != (zc->blockState).matchState.window.dictLimit)) {
    __assert_fail("ms->dictMatchState == NULL || ms->loadedDictEnd == ms->window.dictLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0xc63,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
  }
  pBVar2 = (zc->blockState).matchState.window.base;
  uVar13 = (int)src - (int)pBVar2;
  if (0xfffffffe < (long)src - (long)pBVar2) {
    __assert_fail("istart - base < (ptrdiff_t)(U32)(-1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0xc69,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
  }
  if ((zc->blockState).matchState.nextToUpdate + 0x180 < uVar13) {
    if ((uVar13 - (zc->blockState).matchState.nextToUpdate) - 0x180 < 0xc1) {
      local_100 = (uVar13 - (zc->blockState).matchState.nextToUpdate) + -0x180;
    }
    else {
      local_100 = 0xc0;
    }
    (zc->blockState).matchState.nextToUpdate = uVar13 - local_100;
  }
  dictMode_00 = ZSTD_matchState_dictMode(ms_00);
  for (ldmSeqStore.capacity._4_4_ = 0; ldmSeqStore.capacity._4_4_ < 3;
      ldmSeqStore.capacity._4_4_ = ldmSeqStore.capacity._4_4_ + 1) {
    ((zc->blockState).nextCBlock)->rep[ldmSeqStore.capacity._4_4_] =
         ((zc->blockState).prevCBlock)->rep[ldmSeqStore.capacity._4_4_];
  }
  if ((zc->externSeqStore).pos < (zc->externSeqStore).size) {
    if ((zc->appliedParams).ldmParams.enableLdm != ZSTD_ps_disable) {
      __assert_fail("zc->appliedParams.ldmParams.enableLdm == ZSTD_ps_disable",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0xc76,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
    }
    if ((zc->appliedParams).useSequenceProducer != 0) {
      return 0xffffffffffffffd7;
    }
    sStack_70 = ZSTD_ldm_blockCompress
                          (&zc->externSeqStore,ms_00,&zc->seqStore,
                           ((zc->blockState).nextCBlock)->rep,(zc->appliedParams).useRowMatchFinder,
                           src,srcSize);
    if ((zc->externSeqStore).size < (zc->externSeqStore).pos) {
      __assert_fail("zc->externSeqStore.pos <= zc->externSeqStore.size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0xc87,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
    }
  }
  else if ((zc->appliedParams).ldmParams.enableLdm == ZSTD_ps_enable) {
    memset(&err_code,0,0x28);
    if ((zc->appliedParams).useSequenceProducer != 0) {
      return 0xffffffffffffffd7;
    }
    err_code = (size_t)zc->ldmSequences;
    ldmSeqStore.size = zc->maxNbLdmSequences;
    sVar14 = ZSTD_ldm_generateSequences
                       (&zc->ldmState,(rawSeqStore_t *)&err_code,&(zc->appliedParams).ldmParams,src,
                        srcSize);
    uVar13 = ERR_isError(sVar14);
    if (uVar13 != 0) {
      return sVar14;
    }
    sStack_70 = ZSTD_ldm_blockCompress
                          ((rawSeqStore_t *)&err_code,ms_00,&zc->seqStore,
                           ((zc->blockState).nextCBlock)->rep,(zc->appliedParams).useRowMatchFinder,
                           src,srcSize);
    if (ldmSeqStore.seq != (rawSeq *)ldmSeqStore.posInSequence) {
      __assert_fail("ldmSeqStore.pos == ldmSeqStore.size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0xca0,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
    }
  }
  else if ((zc->appliedParams).useSequenceProducer == 0) {
    p_Var15 = ZSTD_selectBlockCompressor
                        ((zc->appliedParams).cParams.strategy,(zc->appliedParams).useRowMatchFinder,
                         dictMode_00);
    (zc->blockState).matchState.ldmSeqStore = (rawSeqStore_t *)0x0;
    sStack_70 = (*p_Var15)(ms_00,&zc->seqStore,((zc->blockState).nextCBlock)->rep,src,srcSize);
  }
  else {
    sVar14 = (zc->externalMatchCtx).seqBufferCapacity;
    uVar16 = (undefined4)sVar14;
    uStack_104 = (undefined4)(sVar14 >> 0x20);
    sVar14 = ZSTD_sequenceBound(srcSize);
    if (CONCAT44(uStack_104,uVar16) < sVar14) {
      __assert_fail("zc->externalMatchCtx.seqBufferCapacity >= ZSTD_sequenceBound(srcSize)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0xca4,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
    }
    if ((zc->externalMatchCtx).mFinder == (ZSTD_sequenceProducer_F *)0x0) {
      __assert_fail("zc->externalMatchCtx.mFinder != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0xca5,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
    }
    sVar14 = (*(zc->externalMatchCtx).mFinder)
                       ((zc->externalMatchCtx).mState,(zc->externalMatchCtx).seqBuffer,
                        (zc->externalMatchCtx).seqBufferCapacity,src,srcSize,(void *)0x0,0,
                        (zc->appliedParams).compressionLevel,
                        (size_t)(1 << ((byte)(zc->appliedParams).cParams.windowLog & 0x1f)));
    seqPos.posInSrc =
         ZSTD_postProcessSequenceProducerResult
                   ((zc->externalMatchCtx).seqBuffer,sVar14,(zc->externalMatchCtx).seqBufferCapacity
                    ,srcSize);
    uVar13 = ERR_isError(seqPos.posInSrc);
    if (uVar13 == 0) {
      memset(&seqLenSum,0,0x10);
      sVar14 = ZSTD_fastSequenceLengthSum((zc->externalMatchCtx).seqBuffer,seqPos.posInSrc);
      if (srcSize < sVar14) {
        return 0xffffffffffffff95;
      }
      sVar14 = ZSTD_copySequencesToSeqStoreExplicitBlockDelim
                         (zc,(ZSTD_sequencePosition *)&seqLenSum,(zc->externalMatchCtx).seqBuffer,
                          seqPos.posInSrc,src,srcSize,(zc->appliedParams).searchForExternalRepcodes)
      ;
      uVar13 = ERR_isError(sVar14);
      if (uVar13 != 0) {
        return sVar14;
      }
      (zc->blockState).matchState.ldmSeqStore = (rawSeqStore_t *)0x0;
      return 0;
    }
    if ((zc->appliedParams).enableMatchFinderFallback == 0) {
      return seqPos.posInSrc;
    }
    p_Var15 = ZSTD_selectBlockCompressor
                        ((zc->appliedParams).cParams.strategy,(zc->appliedParams).useRowMatchFinder,
                         dictMode_00);
    (zc->blockState).matchState.ldmSeqStore = (rawSeqStore_t *)0x0;
    sStack_70 = (*p_Var15)(ms_00,&zc->seqStore,((zc->blockState).nextCBlock)->rep,src,srcSize);
  }
  ZSTD_storeLastLiterals(&zc->seqStore,(BYTE *)((long)src + (srcSize - sStack_70)),sStack_70);
  return 0;
}

Assistant:

static size_t ZSTD_buildSeqStore(ZSTD_CCtx* zc, const void* src, size_t srcSize)
{
    ZSTD_matchState_t* const ms = &zc->blockState.matchState;
    DEBUGLOG(5, "ZSTD_buildSeqStore (srcSize=%zu)", srcSize);
    assert(srcSize <= ZSTD_BLOCKSIZE_MAX);
    /* Assert that we have correctly flushed the ctx params into the ms's copy */
    ZSTD_assertEqualCParams(zc->appliedParams.cParams, ms->cParams);
    /* TODO: See 3090. We reduced MIN_CBLOCK_SIZE from 3 to 2 so to compensate we are adding
     * additional 1. We need to revisit and change this logic to be more consistent */
    if (srcSize < MIN_CBLOCK_SIZE+ZSTD_blockHeaderSize+1+1) {
        if (zc->appliedParams.cParams.strategy >= ZSTD_btopt) {
            ZSTD_ldm_skipRawSeqStoreBytes(&zc->externSeqStore, srcSize);
        } else {
            ZSTD_ldm_skipSequences(&zc->externSeqStore, srcSize, zc->appliedParams.cParams.minMatch);
        }
        return ZSTDbss_noCompress; /* don't even attempt compression below a certain srcSize */
    }
    ZSTD_resetSeqStore(&(zc->seqStore));
    /* required for optimal parser to read stats from dictionary */
    ms->opt.symbolCosts = &zc->blockState.prevCBlock->entropy;
    /* tell the optimal parser how we expect to compress literals */
    ms->opt.literalCompressionMode = zc->appliedParams.literalCompressionMode;
    /* a gap between an attached dict and the current window is not safe,
     * they must remain adjacent,
     * and when that stops being the case, the dict must be unset */
    assert(ms->dictMatchState == NULL || ms->loadedDictEnd == ms->window.dictLimit);

    /* limited update after a very long match */
    {   const BYTE* const base = ms->window.base;
        const BYTE* const istart = (const BYTE*)src;
        const U32 curr = (U32)(istart-base);
        if (sizeof(ptrdiff_t)==8) assert(istart - base < (ptrdiff_t)(U32)(-1));   /* ensure no overflow */
        if (curr > ms->nextToUpdate + 384)
            ms->nextToUpdate = curr - MIN(192, (U32)(curr - ms->nextToUpdate - 384));
    }

    /* select and store sequences */
    {   ZSTD_dictMode_e const dictMode = ZSTD_matchState_dictMode(ms);
        size_t lastLLSize;
        {   int i;
            for (i = 0; i < ZSTD_REP_NUM; ++i)
                zc->blockState.nextCBlock->rep[i] = zc->blockState.prevCBlock->rep[i];
        }
        if (zc->externSeqStore.pos < zc->externSeqStore.size) {
            assert(zc->appliedParams.ldmParams.enableLdm == ZSTD_ps_disable);

            /* External matchfinder + LDM is technically possible, just not implemented yet.
             * We need to revisit soon and implement it. */
            RETURN_ERROR_IF(
                zc->appliedParams.useSequenceProducer,
                parameter_combination_unsupported,
                "Long-distance matching with external sequence producer enabled is not currently supported."
            );

            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&zc->externSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       zc->appliedParams.useRowMatchFinder,
                                       src, srcSize);
            assert(zc->externSeqStore.pos <= zc->externSeqStore.size);
        } else if (zc->appliedParams.ldmParams.enableLdm == ZSTD_ps_enable) {
            rawSeqStore_t ldmSeqStore = kNullRawSeqStore;

            /* External matchfinder + LDM is technically possible, just not implemented yet.
             * We need to revisit soon and implement it. */
            RETURN_ERROR_IF(
                zc->appliedParams.useSequenceProducer,
                parameter_combination_unsupported,
                "Long-distance matching with external sequence producer enabled is not currently supported."
            );

            ldmSeqStore.seq = zc->ldmSequences;
            ldmSeqStore.capacity = zc->maxNbLdmSequences;
            /* Updates ldmSeqStore.size */
            FORWARD_IF_ERROR(ZSTD_ldm_generateSequences(&zc->ldmState, &ldmSeqStore,
                                               &zc->appliedParams.ldmParams,
                                               src, srcSize), "");
            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&ldmSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       zc->appliedParams.useRowMatchFinder,
                                       src, srcSize);
            assert(ldmSeqStore.pos == ldmSeqStore.size);
        } else if (zc->appliedParams.useSequenceProducer) {
            assert(
                zc->externalMatchCtx.seqBufferCapacity >= ZSTD_sequenceBound(srcSize)
            );
            assert(zc->externalMatchCtx.mFinder != NULL);

            {   U32 const windowSize = (U32)1 << zc->appliedParams.cParams.windowLog;

                size_t const nbExternalSeqs = (zc->externalMatchCtx.mFinder)(
                    zc->externalMatchCtx.mState,
                    zc->externalMatchCtx.seqBuffer,
                    zc->externalMatchCtx.seqBufferCapacity,
                    src, srcSize,
                    NULL, 0,  /* dict and dictSize, currently not supported */
                    zc->appliedParams.compressionLevel,
                    windowSize
                );

                size_t const nbPostProcessedSeqs = ZSTD_postProcessSequenceProducerResult(
                    zc->externalMatchCtx.seqBuffer,
                    nbExternalSeqs,
                    zc->externalMatchCtx.seqBufferCapacity,
                    srcSize
                );

                /* Return early if there is no error, since we don't need to worry about last literals */
                if (!ZSTD_isError(nbPostProcessedSeqs)) {
                    ZSTD_sequencePosition seqPos = {0,0,0};
                    size_t const seqLenSum = ZSTD_fastSequenceLengthSum(zc->externalMatchCtx.seqBuffer, nbPostProcessedSeqs);
                    RETURN_ERROR_IF(seqLenSum > srcSize, externalSequences_invalid, "External sequences imply too large a block!");
                    FORWARD_IF_ERROR(
                        ZSTD_copySequencesToSeqStoreExplicitBlockDelim(
                            zc, &seqPos,
                            zc->externalMatchCtx.seqBuffer, nbPostProcessedSeqs,
                            src, srcSize,
                            zc->appliedParams.searchForExternalRepcodes
                        ),
                        "Failed to copy external sequences to seqStore!"
                    );
                    ms->ldmSeqStore = NULL;
                    DEBUGLOG(5, "Copied %lu sequences from external sequence producer to internal seqStore.", (unsigned long)nbExternalSeqs);
                    return ZSTDbss_compress;
                }

                /* Propagate the error if fallback is disabled */
                if (!zc->appliedParams.enableMatchFinderFallback) {
                    return nbPostProcessedSeqs;
                }

                /* Fallback to software matchfinder */
                {   ZSTD_blockCompressor const blockCompressor = ZSTD_selectBlockCompressor(zc->appliedParams.cParams.strategy,
                                                                                            zc->appliedParams.useRowMatchFinder,
                                                                                            dictMode);
                    ms->ldmSeqStore = NULL;
                    DEBUGLOG(
                        5,
                        "External sequence producer returned error code %lu. Falling back to internal parser.",
                        (unsigned long)nbExternalSeqs
                    );
                    lastLLSize = blockCompressor(ms, &zc->seqStore, zc->blockState.nextCBlock->rep, src, srcSize);
            }   }
        } else {   /* not long range mode and no external matchfinder */
            ZSTD_blockCompressor const blockCompressor = ZSTD_selectBlockCompressor(zc->appliedParams.cParams.strategy,
                                                                                    zc->appliedParams.useRowMatchFinder,
                                                                                    dictMode);
            ms->ldmSeqStore = NULL;
            lastLLSize = blockCompressor(ms, &zc->seqStore, zc->blockState.nextCBlock->rep, src, srcSize);
        }
        {   const BYTE* const lastLiterals = (const BYTE*)src + srcSize - lastLLSize;
            ZSTD_storeLastLiterals(&zc->seqStore, lastLiterals, lastLLSize);
    }   }
    return ZSTDbss_compress;
}